

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::
RegisterDecorationsForStructMember<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
          (ValidationState_t *this,uint32_t struct_id,uint32_t member_index,
          _Rb_tree_const_iterator<spvtools::val::Decoration> begin,
          _Rb_tree_const_iterator<spvtools::val::Decoration> end)

{
  bool bVar1;
  mapped_type *this_00;
  reference pDVar2;
  undefined1 local_60 [8];
  Decoration dec;
  _Rb_tree_const_iterator<spvtools::val::Decoration> iter;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *cur_decs;
  uint32_t member_index_local;
  uint32_t struct_id_local;
  ValidationState_t *this_local;
  _Rb_tree_const_iterator<spvtools::val::Decoration> end_local;
  _Rb_tree_const_iterator<spvtools::val::Decoration> begin_local;
  
  cur_decs._0_4_ = member_index;
  cur_decs._4_4_ = struct_id;
  _member_index_local = this;
  this_local = (ValidationState_t *)end._M_node;
  end_local = begin;
  this_00 = std::
            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
            ::operator[](&this->id_decorations_,(key_type *)((long)&cur_decs + 4));
  dec._32_8_ = end_local._M_node;
  while( true ) {
    bVar1 = std::operator!=((_Self *)&dec.struct_member_index_,(_Self *)&this_local);
    if (!bVar1) break;
    pDVar2 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*
                       ((_Rb_tree_const_iterator<spvtools::val::Decoration> *)
                        &dec.struct_member_index_);
    Decoration::Decoration((Decoration *)local_60,pDVar2);
    Decoration::set_struct_member_index((Decoration *)local_60,(uint32_t)cur_decs);
    std::
    set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
    ::insert(this_00,(value_type *)local_60);
    Decoration::~Decoration((Decoration *)local_60);
    std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++
              ((_Rb_tree_const_iterator<spvtools::val::Decoration> *)&dec.struct_member_index_);
  }
  return;
}

Assistant:

void RegisterDecorationsForStructMember(uint32_t struct_id,
                                          uint32_t member_index, InputIt begin,
                                          InputIt end) {
    std::set<Decoration>& cur_decs = id_decorations_[struct_id];
    for (InputIt iter = begin; iter != end; ++iter) {
      Decoration dec = *iter;
      dec.set_struct_member_index(member_index);
      cur_decs.insert(dec);
    }
  }